

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::
any_function<dlib::member_function_pointer<dlib::vector<long,2l>const&,bool,unsigned_long,void>>
          (any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> *this
          ,member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void> *item)

{
  derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
  *in_RSI;
  unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  *in_RDI;
  unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  *this_00;
  member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>
  *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  std::
  unique_ptr<dlib::any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::Tbase<void(dlib::vector<long,2l>const&,bool,unsigned_long)>,std::default_delete<dlib::any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::Tbase<void(dlib::vector<long,2l>const&,bool,unsigned_long)>>>
  ::
  unique_ptr<std::default_delete<dlib::any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::Tbase<void(dlib::vector<long,2l>const&,bool,unsigned_long)>>,void>
            (in_RDI);
  operator_new(0x50);
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::
  derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
  ::derived(in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  ::reset(this_00,(pointer)in_RDI);
  return;
}

Assistant:

any_function (
    const T& item
)
{
    typedef typename basic_type<T>::type U;
    data.reset(new derived<U,function_type>(item));
}